

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

Vector<char,_std::allocator<char>_> *
amrex::SerializeStringArray
          (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *stringArray)

{
  long lVar1;
  Long LVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  char *__dest;
  char *__src;
  Vector<char,_std::allocator<char>_> *in_RDI;
  int i;
  ostringstream stringStream;
  Vector<char,_std::allocator<char>_> *charArray;
  size_type in_stack_fffffffffffffdd8;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [35];
  undefined1 local_19d;
  int local_18c;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  for (local_18c = 0; lVar1 = (long)local_18c,
      LVar2 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x11e9836), lVar1 < LVar2; local_18c = local_18c + 1) {
    pbVar3 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    poVar4 = std::operator<<((ostream *)local_188,(string *)pbVar3);
    std::operator<<(poVar4,'\n');
  }
  local_19d = 0;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::size();
  std::allocator<char>::allocator();
  Vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(allocator_type *)0x11e98ff);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string(local_1c0);
  __dest = Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0x11e991f);
  std::__cxx11::ostringstream::str();
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  std::__cxx11::string::~string(local_1e8);
  local_19d = 1;
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

amrex::Vector<char> amrex::SerializeStringArray(const Vector<std::string> &stringArray)
{
  std::ostringstream stringStream;
  for(int i(0); i < stringArray.size(); ++i) {
    stringStream << stringArray[i] << '\n';
  }

  Vector<char> charArray(stringStream.str().size() + 1);
  std::strcpy(charArray.dataPtr(), stringStream.str().c_str());  // null terminated

  return charArray;
}